

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

void __thiscall
xLearn::LibsvmParser::Parse(LibsvmParser *this,char *buf,uint64 size,DMatrix *matrix,bool reset)

{
  undefined1 auVar1 [16];
  int iVar2;
  ostream *poVar3;
  ostream *poVar4;
  uint64 uVar5;
  char *pcVar6;
  reference pvVar7;
  char *pcVar8;
  long in_RCX;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  byte in_R8B;
  double dVar9;
  real_t value_1;
  index_t idx_1;
  char *value_char_1;
  char *idx_char_1;
  real_t value;
  index_t idx;
  char *value_char;
  char *idx_char;
  real_t norm;
  char *y_char;
  int i;
  uint64 rd_size;
  uint64 pos;
  DMatrix *in_stack_fffffffffffffe10;
  DMatrix *in_stack_fffffffffffffe50;
  string *in_stack_fffffffffffffe78;
  allocator *function;
  undefined8 in_stack_fffffffffffffe80;
  string *in_stack_fffffffffffffe88;
  uint64 in_stack_fffffffffffffe90;
  LogSeverity LVar10;
  char *in_stack_fffffffffffffe98;
  char *in_stack_fffffffffffffea0;
  Parser *in_stack_fffffffffffffea8;
  char *in_stack_fffffffffffffef0;
  char *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  float fVar11;
  allocator local_d1;
  string local_d0 [39];
  allocator local_a9;
  string local_a8 [32];
  Logger local_88;
  allocator local_81;
  string local_80 [55];
  allocator local_49;
  string local_48 [32];
  Logger local_28;
  byte local_21;
  long local_20;
  ulong local_18;
  
  iVar2 = (int)((ulong)in_stack_fffffffffffffe80 >> 0x20);
  local_21 = in_R8B & 1;
  if (in_RSI == 0) {
    Logger::Logger(&local_28,ERR);
    LVar10 = (LogSeverity)(in_stack_fffffffffffffe90 >> 0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/parser.cc"
               ,&local_49);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"Parse",&local_81);
    poVar3 = Logger::Start(LVar10,in_stack_fffffffffffffe88,iVar2,in_stack_fffffffffffffe78);
    poVar3 = std::operator<<(poVar3,"CHECK failed ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/parser.cc"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x4c);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"buf");
    std::operator<<(poVar3," == NULL \n");
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    Logger::~Logger((Logger *)in_stack_fffffffffffffe10);
    abort();
  }
  if (in_RDX == 0) {
    local_18 = in_RDX;
    Logger::Logger(&local_88,ERR);
    LVar10 = (LogSeverity)(in_stack_fffffffffffffe90 >> 0x20);
    function = &local_a9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_a8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/parser.cc"
               ,function);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,"Parse",&local_d1);
    poVar3 = Logger::Start(LVar10,in_stack_fffffffffffffe88,iVar2,(string *)function);
    poVar3 = std::operator<<(poVar3,"CHECK_GT failed ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/parser.cc"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x4d);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"size");
    poVar3 = std::operator<<(poVar3," = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_18);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"0");
    poVar3 = std::operator<<(poVar3," = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar3,0);
    std::operator<<(poVar4,"\n");
    std::__cxx11::string::~string(local_d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    Logger::~Logger((Logger *)poVar3);
    abort();
  }
  local_20 = in_RCX;
  if (local_21 != 0) {
    DMatrix::Reset(in_stack_fffffffffffffe50);
  }
  while (uVar5 = Parser::get_line_from_buffer
                           (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                            in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                            (uint64)in_stack_fffffffffffffe88), uVar5 != 0) {
    DMatrix::AddRow(in_stack_fffffffffffffe10);
    iVar2 = *(int *)(local_20 + 0x10) + -1;
    if ((*(byte *)(in_RDI + 8) & 1) == 0) {
      pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)(local_20 + 0x30),(long)iVar2);
      *pvVar7 = -2.0;
    }
    else {
      pcVar6 = (char *)std::__cxx11::string::c_str();
      pcVar6 = strtok(line_buf,pcVar6);
      dVar9 = atof(pcVar6);
      pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)(local_20 + 0x30),(long)iVar2);
      *pvVar7 = (float)dVar9;
    }
    fVar11 = 0.0;
    if ((*(byte *)(in_RDI + 8) & 1) == 0) {
      in_stack_fffffffffffffef8 = strtok(line_buf,":");
      pcVar6 = (char *)std::__cxx11::string::c_str();
      in_stack_fffffffffffffef0 = strtok((char *)0x0,pcVar6);
      if ((in_stack_fffffffffffffef8 != (char *)0x0) && (*in_stack_fffffffffffffef8 != '\n')) {
        atoi(in_stack_fffffffffffffef8);
        dVar9 = atof(in_stack_fffffffffffffef0);
        DMatrix::AddNode((DMatrix *)CONCAT44(fVar11,in_stack_ffffffffffffff00),
                         (index_t)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                         (index_t)in_stack_fffffffffffffef8,
                         (real_t)((ulong)in_stack_fffffffffffffef0 >> 0x20),
                         (index_t)in_stack_fffffffffffffef0);
        auVar1 = vfmadd213ss_fma(ZEXT416((uint)(float)dVar9),ZEXT416((uint)(float)dVar9),
                                 ZEXT416((uint)fVar11));
        fVar11 = auVar1._0_4_;
      }
    }
    while( true ) {
      pcVar6 = strtok((char *)0x0,":");
      pcVar8 = (char *)std::__cxx11::string::c_str();
      pcVar8 = strtok((char *)0x0,pcVar8);
      if ((pcVar6 == (char *)0x0) || (*pcVar6 == '\n')) break;
      atoi(pcVar6);
      dVar9 = atof(pcVar8);
      DMatrix::AddNode((DMatrix *)CONCAT44(fVar11,in_stack_ffffffffffffff00),
                       (index_t)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                       (index_t)in_stack_fffffffffffffef8,
                       (real_t)((ulong)in_stack_fffffffffffffef0 >> 0x20),
                       (index_t)in_stack_fffffffffffffef0);
      auVar1 = vfmadd213ss_fma(ZEXT416((uint)(float)dVar9),ZEXT416((uint)(float)dVar9),
                               ZEXT416((uint)fVar11));
      fVar11 = auVar1._0_4_;
    }
    pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(local_20 + 0x48),(long)iVar2);
    *pvVar7 = 1.0 / fVar11;
  }
  return;
}

Assistant:

void LibsvmParser::Parse(char* buf, 
                         uint64 size, 
                         DMatrix& matrix, 
                         bool reset) {
  CHECK_NOTNULL(buf);
  CHECK_GT(size, 0);
  // Clear the data matrix
  if (reset) { 
    matrix.Reset(); 
  }
  // Parse every line
  uint64 pos = 0;
  for (;;) {
    uint64 rd_size = get_line_from_buffer(line_buf, buf, pos, size);
    if (rd_size == 0) break;
    pos += rd_size;
    matrix.AddRow();
    int i = matrix.row_length - 1;
    if (reset == false) {
    }
    // Add Y
    if (has_label_) {  // for training task
      char *y_char = strtok(line_buf, splitor_.c_str());
      matrix.Y[i] = atof(y_char);
    } else {  // for predict task
      matrix.Y[i] = -2;
    }
    // Add features
    real_t norm = 0.0;
    // The first element
    if (!has_label_) {
      char *idx_char = strtok(line_buf, ":");
      char *value_char = strtok(nullptr, splitor_.c_str());
      if (idx_char != nullptr && *idx_char != '\n') {
        index_t idx = atoi(idx_char);
        real_t value = atof(value_char);
        matrix.AddNode(i, idx, value);
        norm += value*value;
      }
    }
    // The remain elements
    for (;;) {
      char *idx_char = strtok(nullptr, ":");
      char *value_char = strtok(nullptr, splitor_.c_str());
      if (idx_char == nullptr || *idx_char == '\n') {
        break;
      }
      index_t idx = atoi(idx_char);
      real_t value = atof(value_char);
      matrix.AddNode(i, idx, value);
      norm += value*value;
    }
    norm = 1.0f / norm;
    matrix.norm[i] = norm;
  }
}